

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::
CartesianProductGenerator<google::protobuf::io::(anonymous_namespace)::Fixed16Case,_int>::
IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL>_>::Advance
          (IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL>_> *this)

{
  bool bVar1;
  __tuple_element_t<1UL,_tuple<ParamIterator<Fixed16Case>,_ParamIterator<int>_>_> *this_00;
  IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL>_> *this_local;
  
  bVar1 = AtEnd(this);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!AtEnd()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/googletest-src/googletest/include/gtest/internal/gtest-param-util.h"
                  ,0x361,
                  "virtual void testing::internal::CartesianProductGenerator<google::protobuf::io::(anonymous namespace)::Fixed16Case, int>::IteratorImpl<std::integer_sequence<unsigned long, 0, 1>>::Advance() [T = <google::protobuf::io::(anonymous namespace)::Fixed16Case, int>, I = std::integer_sequence<unsigned long, 0, 1>]"
                 );
  }
  this_00 = std::
            get<1ul,testing::internal::ParamIterator<google::protobuf::io::(anonymous_namespace)::Fixed16Case>,testing::internal::ParamIterator<int>>
                      (&this->current_);
  ParamIterator<int>::operator++(this_00);
  CartesianProductGenerator<google::protobuf::io::(anonymous_namespace)::Fixed16Case,int>::
  IteratorImpl<std::integer_sequence<unsigned_long,0ul,1ul>>::AdvanceIfEnd<1ul>
            ((IteratorImpl<std::integer_sequence<unsigned_long,0ul,1ul>> *)this);
  ComputeCurrentValue(this);
  return;
}

Assistant:

void Advance() override {
      assert(!AtEnd());
      // Advance the last iterator.
      ++std::get<sizeof...(T) - 1>(current_);
      // if that reaches end, propagate that up.
      AdvanceIfEnd<sizeof...(T) - 1>();
      ComputeCurrentValue();
    }